

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear_system.cpp
# Opt level: O2

ostream * operator<<(ostream *out,LinearSystem *system)

{
  string local_30;
  
  if (Options::output_type == 1) {
    LinearSystem::ToLaTex_abi_cxx11_(&local_30,system);
    std::operator<<(out,(string *)&local_30);
  }
  else {
    if (Options::output_type != 0) {
      return out;
    }
    LinearSystem::ToString_abi_cxx11_(&local_30,system);
    std::operator<<(out,(string *)&local_30);
  }
  std::__cxx11::string::~string((string *)&local_30);
  return out;
}

Assistant:

std::ostream& operator<<(std::ostream& out, const LinearSystem& system) {
  if (Options::output_type == Options::OutputType::Standard) {
    out << system.ToString();
  } else if (Options::output_type == Options::OutputType::LaTex) {
    out << system.ToLaTex();
  }

  return out;
}